

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setsout.c
# Opt level: O0

void set_sysout(int version,char *sysout_file_name)

{
  __off_t _Var1;
  ssize_t sVar2;
  char local_1d8 [8];
  char errmsg [255];
  undefined1 local_cc [8];
  IFPAGE ifpage;
  int sysout;
  char *sysout_file_name_local;
  int version_local;
  
  unique0x100001e6 = sysout_file_name;
  ifpage.ndirtypages = open(sysout_file_name,2);
  if (ifpage.ndirtypages == -1) {
    sprintf(local_1d8,"sysout_loader: can\'t open sysout file: %s",stack0xffffffffffffffe8);
    perror(local_1d8);
    exit(-1);
  }
  _Var1 = lseek(ifpage.ndirtypages,0x200,0);
  if (_Var1 == -1) {
    perror("sysout_loader: can\'t seek to IFPAGE");
    exit(-1);
  }
  sVar2 = read(ifpage.ndirtypages,local_cc,0xb0);
  if (sVar2 == -1) {
    perror("sysout_loader: can\'t read IFPAGE");
    exit(-1);
  }
  word_swap_page(local_cc,0x2c);
  ifpage.hardreturnfxp = (DLword)version;
  ifpage.faultfxp = ifpage.hardreturnfxp;
  _Var1 = lseek(ifpage.ndirtypages,0x200,0);
  if (_Var1 == -1) {
    perror("sysout_loader: can\'t seek to IFPAGE");
    exit(-1);
  }
  sVar2 = write(ifpage.ndirtypages,local_cc,0xb0);
  if (sVar2 == -1) {
    perror("Can\'t write IFPAGE");
    exit(-1);
  }
  close(ifpage.ndirtypages);
  printf("%d",(ulong)ifpage.faultfxp);
  return;
}

Assistant:

void set_sysout(int version, char *sysout_file_name) {
  int sysout;    /* SysoutFile descriptor */
  IFPAGE ifpage; /* IFPAGE */
  char errmsg[255];

  /*
   * first read the IFPAGE(InterfacePage)
   */

  /* open SysoutFile */
  sysout = open(sysout_file_name, O_RDWR);
  if (sysout == -1) {
    sprintf(errmsg, "sysout_loader: can't open sysout file: %s", sysout_file_name);
    perror(errmsg);
    exit(-1);
  }
  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }
  /* reads IFPAGE into scratch_page */
  if (read(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("sysout_loader: can't read IFPAGE");
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)&ifpage, (3 + sizeof(IFPAGE)) / 4);
#endif

  ifpage.lversion = version;
  ifpage.minbversion = version;

  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }
  /* reads IFPAGE into scratch_page */
  if (write(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("Can't write IFPAGE");
    exit(-1);
  }

  close(sysout);
  printf("%d", ifpage.minbversion);
}